

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionParser.cpp
# Opt level: O0

void __thiscall
ConditionParser::ConditionParser
          (ConditionParser *this,string_conflict *left,string_conflict *oper,string_conflict *right,
          DataVars *dataVars)

{
  double dVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_c8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  local_80;
  undefined1 local_48 [8];
  ExpressionUtils expUtils;
  DataVars *dataVars_local;
  string_conflict *right_local;
  string_conflict *oper_local;
  string_conflict *left_local;
  ConditionParser *this_local;
  
  expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dataVars;
  std::__cxx11::string::string((string *)&this->oper);
  this->dataVars =
       (DataVars *)
       expUtils.deathMap.super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  ExpressionUtils::ExpressionUtils((ExpressionUtils *)local_48);
  DataVars::getSymbolTable_abi_cxx11_(&local_80,this->dataVars);
  dVar1 = ExpressionUtils::calculateInfixStr((ExpressionUtils *)local_48,(string *)left,&local_80);
  this->left = dVar1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~unordered_map(&local_80);
  std::__cxx11::string::operator=((string *)&this->oper,(string *)oper);
  DataVars::getSymbolTable_abi_cxx11_(&local_c8,this->dataVars);
  dVar1 = ExpressionUtils::calculateInfixStr((ExpressionUtils *)local_48,(string *)right,&local_c8);
  this->right = dVar1;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~unordered_map(&local_c8);
  ExpressionUtils::~ExpressionUtils((ExpressionUtils *)local_48);
  return;
}

Assistant:

ConditionParser::ConditionParser(const string &left, const string &oper, const string &right, DataVars *dataVars) {
    this->dataVars = dataVars;
    ExpressionUtils expUtils;
    this->left = expUtils.calculateInfixStr(left, this->dataVars->getSymbolTable());
    this->oper = oper;
    this->right = expUtils.calculateInfixStr(right, this->dataVars->getSymbolTable());
}